

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix.cc
# Opt level: O2

ssize_t ixxx::posix::readlinkat(int __fd,char *__path,char *__buf,size_t __len)

{
  ssize_t sVar1;
  readlinkat_error *this;
  int *piVar2;
  
  sVar1 = ::readlinkat(__fd,__path,__buf,__len);
  if (sVar1 != -1) {
    return sVar1;
  }
  this = (readlinkat_error *)__cxa_allocate_exception(0x20);
  piVar2 = __errno_location();
  readlinkat_error::sys_error(this,*piVar2,(char *)0x0,ERRNO);
  __cxa_throw(this,&readlinkat_error::typeinfo,ixxx::sys_error::~sys_error);
}

Assistant:

size_t readlinkat(int dirfd, const char *pathname, char *buf, size_t n)
    {
        ssize_t r = ::readlinkat(dirfd, pathname, buf, n);
        if (r == -1)
            throw readlinkat_error(errno);
        return r;
    }